

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dynamic.hpp
# Opt level: O2

void __thiscall
ELFIO::dynamic_section_accessor_template<ELFIO::section>::generic_get_entry_dyn<ELFIO::Elf32_Dyn>
          (dynamic_section_accessor_template<ELFIO::section> *this,Elf_Xword index,Elf_Xword *tag,
          Elf_Xword *value)

{
  bool bVar1;
  uint uVar2;
  elfio *peVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar7;
  undefined4 extraout_var_05;
  Elf_Xword EVar8;
  ulong uVar9;
  
  peVar3 = this->elf_file;
  iVar5 = (*this->dynamic_section->_vptr_section[0x18])();
  if ((CONCAT44(extraout_var,iVar5) != 0) &&
     (iVar5 = (*this->dynamic_section->_vptr_section[0xf])(), 7 < CONCAT44(extraout_var_00,iVar5)))
  {
    iVar5 = (*this->dynamic_section->_vptr_section[0x13])();
    iVar6 = (*this->dynamic_section->_vptr_section[0xf])();
    EVar8 = 0;
    if (CONCAT44(extraout_var_01,iVar5) / CONCAT44(extraout_var_02,iVar6) - 1 < index) {
      *tag = 0;
      goto LAB_00111c14;
    }
    iVar5 = (*this->dynamic_section->_vptr_section[0xf])
                      (this->dynamic_section,0,
                       CONCAT44(extraout_var_01,iVar5) % CONCAT44(extraout_var_02,iVar6));
    uVar9 = CONCAT44(extraout_var_03,iVar5) * index;
    iVar5 = (*this->dynamic_section->_vptr_section[0x13])();
    uVar7 = CONCAT44(extraout_var_04,iVar5) - 8;
    if (uVar9 < uVar7 || uVar9 - uVar7 == 0) {
      iVar5 = (*this->dynamic_section->_vptr_section[0x18])();
      uVar2 = *(uint *)(CONCAT44(extraout_var_05,iVar5) + uVar9);
      bVar1 = (peVar3->convertor).need_conversion;
      uVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (bVar1 == false) {
        uVar4 = uVar2;
      }
      *tag = (long)(int)uVar4;
      if (((0x21 < uVar4) || ((0x2781ccf06U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) ||
         (EVar8 = 0, (0x1410001UL >> ((ulong)uVar4 & 0x3f) & 1) == 0)) {
        uVar2 = *(uint *)(CONCAT44(extraout_var_05,iVar5) + 4 + uVar9);
        uVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        if (bVar1 == false) {
          uVar4 = uVar2;
        }
        EVar8 = (Elf_Xword)uVar4;
      }
      goto LAB_00111c14;
    }
  }
  *tag = 0;
  EVar8 = 0;
LAB_00111c14:
  *value = EVar8;
  return;
}

Assistant:

void generic_get_entry_dyn( Elf_Xword  index,
                                Elf_Xword& tag,
                                Elf_Xword& value ) const
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        // Check unusual case when dynamic section has no data
        if ( dynamic_section->get_data() == nullptr ||
             dynamic_section->get_entry_size() < sizeof( T ) ) {
            tag   = DT_NULL;
            value = 0;
            return;
        }

        // Check for integer overflow in size calculation
        if (index > (dynamic_section->get_size() / dynamic_section->get_entry_size()) - 1) {
            tag   = DT_NULL;
            value = 0;
            return;
        }

        // Check for integer overflow in pointer arithmetic
        Elf_Xword offset = index * dynamic_section->get_entry_size();
        if (offset > dynamic_section->get_size() - sizeof(T)) {
            tag   = DT_NULL;
            value = 0;
            return;
        }

        const T* pEntry = reinterpret_cast<const T*>(
            dynamic_section->get_data() + offset );
        tag = convertor( pEntry->d_tag );
        switch ( tag ) {
        case DT_NULL:
        case DT_SYMBOLIC:
        case DT_TEXTREL:
        case DT_BIND_NOW:
            value = 0;
            break;
        case DT_NEEDED:
        case DT_PLTRELSZ:
        case DT_RELASZ:
        case DT_RELAENT:
        case DT_STRSZ:
        case DT_SYMENT:
        case DT_SONAME:
        case DT_RPATH:
        case DT_RELSZ:
        case DT_RELENT:
        case DT_PLTREL:
        case DT_INIT_ARRAYSZ:
        case DT_FINI_ARRAYSZ:
        case DT_RUNPATH:
        case DT_FLAGS:
        case DT_PREINIT_ARRAYSZ:
            value = convertor( pEntry->d_un.d_val );
            break;
        case DT_PLTGOT:
        case DT_HASH:
        case DT_STRTAB:
        case DT_SYMTAB:
        case DT_RELA:
        case DT_INIT:
        case DT_FINI:
        case DT_REL:
        case DT_DEBUG:
        case DT_JMPREL:
        case DT_INIT_ARRAY:
        case DT_FINI_ARRAY:
        case DT_PREINIT_ARRAY:
        default:
            value = convertor( pEntry->d_un.d_ptr );
            break;
        }
    }